

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cpp
# Opt level: O2

void __thiscall EvalParams::Deserialize(EvalParams *this,json *json)

{
  element_type *peVar1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  bStack_38;
  __shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::make_shared<EvalContext>();
  std::__shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->ctx).super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  peVar1 = (this->ctx).super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&bStack_38,json);
  (*(peVar1->super_JsonProtocol)._vptr_JsonProtocol[3])(peVar1,&bStack_38);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&bStack_38);
  return;
}

Assistant:

void EvalParams::Deserialize(nlohmann::json json) {
	ctx = std::make_shared<EvalContext>();
	ctx->Deserialize(json);
}